

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void yyerror(char *s,...)

{
  char *text;
  char in_AL;
  int offset;
  reference pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&srcfile_abi_cxx11_,(long)(int)(~(uint)(yychar == 0x122) + yylloc.first_line));
  text = (pvVar1->_M_dataplus)._M_p;
  offset = fprintf(_stderr,"%s (%d): ",yyfilename,(ulong)(uint)yylloc.first_line);
  fprintf(_stderr,"%s\n",text);
  underline(offset,yylloc.first_column,yylloc.last_column,text);
  fwrite("\nERROR!\t",8,1,_stderr);
  local_100 = &ap[0].overflow_arg_area;
  local_108 = 0x3000000008;
  local_f8 = local_e8;
  vfprintf(_stderr,s,&local_108);
  fputc(10,_stderr);
  error_count = error_count + 1;
  exit(1);
}

Assistant:

void yyerror(const char *s, ...) 
{
	int lineno = yylloc.first_line - (yychar != EOL ?  1 : 2);
	const char *text = srcfile.at(lineno).c_str();
	auto offset = fprintf(stderr, "%s (%d): ", yyfilename, yylloc.first_line);
	fprintf(stderr, "%s\n", text);
	underline(offset, yylloc.first_column, yylloc.last_column, text);
	fprintf(stderr, "\nERROR!\t");
	va_list ap;
	va_start(ap, s);
	vfprintf(stderr, s, ap);
	fprintf(stderr, "\n");
	error_count++;
	exit(EXIT_FAILURE);
}